

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ApplyWindowSettings(ImGuiWindow *window,ImGuiWindowSettings *settings)

{
  ushort uVar1;
  ushort uVar2;
  ImGuiViewport *pIVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  undefined1 auVar7 [16];
  
  pIVar3 = ImGui::GetMainViewport();
  IVar4 = pIVar3->Pos;
  window->ViewportPos = IVar4;
  if (settings->ViewportId != 0) {
    window->ViewportId = settings->ViewportId;
    auVar7 = pshuflw(ZEXT416((uint)settings->ViewportPos),ZEXT416((uint)settings->ViewportPos),0x60)
    ;
    IVar4.x = (float)(auVar7._0_4_ >> 0x10);
    IVar4.y = (float)(auVar7._4_4_ >> 0x10);
    window->ViewportPos = IVar4;
  }
  auVar7 = pshuflw(ZEXT416((uint)settings->Pos),ZEXT416((uint)settings->Pos),0x60);
  IVar5.x = (float)(int)((float)(auVar7._0_4_ >> 0x10) + IVar4.x);
  IVar5.y = (float)(int)((float)(auVar7._4_4_ >> 0x10) + IVar4.y);
  window->Pos = IVar5;
  uVar1 = (settings->Size).x;
  if ((0 < (short)uVar1) && (uVar2 = (settings->Size).y, 0 < (short)uVar2)) {
    IVar6.x = (float)uVar1;
    IVar6.y = (float)uVar2;
    window->Size = IVar6;
    window->SizeFull = IVar6;
  }
  window->Collapsed = settings->Collapsed;
  window->DockId = settings->DockId;
  window->DockOrder = settings->DockOrder;
  return;
}

Assistant:

static void ApplyWindowSettings(ImGuiWindow* window, ImGuiWindowSettings* settings)
{
    ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    window->ViewportPos = main_viewport->Pos;
    if (settings->ViewportId)
    {
        window->ViewportId = settings->ViewportId;
        window->ViewportPos = ImVec2(settings->ViewportPos.x, settings->ViewportPos.y);
    }
    window->Pos = ImFloor(ImVec2(settings->Pos.x + window->ViewportPos.x, settings->Pos.y + window->ViewportPos.y));
    if (settings->Size.x > 0 && settings->Size.y > 0)
        window->Size = window->SizeFull = ImFloor(ImVec2(settings->Size.x, settings->Size.y));
    window->Collapsed = settings->Collapsed;
    window->DockId = settings->DockId;
    window->DockOrder = settings->DockOrder;
}